

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR NpyArray::ParseFooterZIP
                 (FILE *fp,uint16_t *nrecs,size_t *globalHeaderSize,size_t *globalHeaderOffset)

{
  size_t sVar1;
  uint16_t lenComment;
  uint16_t nrecsOnDisk;
  uint16_t diskStart;
  uint16_t diskNo;
  char footer [32];
  size_t *globalHeaderOffset_local;
  size_t *globalHeaderSize_local;
  uint16_t *nrecs_local;
  FILE *fp_local;
  
  fseek((FILE *)fp,-0x16,2);
  sVar1 = fread(&lenComment,1,0x16,(FILE *)fp);
  if (sVar1 == 0x16) {
    *nrecs = footer._2_2_;
    *globalHeaderSize = (ulong)(uint)footer._4_4_;
    *globalHeaderOffset = (ulong)(uint)footer._8_4_;
    fp_local = (FILE *)0x0;
  }
  else {
    fp_local = (FILE *)anon_var_dwarf_132;
  }
  return (LPCSTR)fp_local;
}

Assistant:

LPCSTR NpyArray::ParseFooterZIP(FILE* fp, uint16_t& nrecs, size_t& globalHeaderSize, size_t& globalHeaderOffset)
{
	char footer[32];
	fseek(fp, -22, SEEK_END);
	if (fread(footer, sizeof(char), 22, fp) != 22)
		return "error: failed footer";
	const uint16_t diskNo = *(uint16_t*)(footer+4); ASSERT(diskNo == 0);
	const uint16_t diskStart = *(uint16_t*)(footer+6); ASSERT(diskStart == 0);
	const uint16_t nrecsOnDisk = *(uint16_t*)(footer+8);
	nrecs = *(uint16_t*)(footer+10); ASSERT(nrecsOnDisk == nrecs);
	globalHeaderSize = *(uint32_t*)(footer+12);
	globalHeaderOffset = *(uint32_t*)(footer+16);
	const uint16_t lenComment = *(uint16_t*)(footer+20); ASSERT(lenComment == 0);
	return NULL;
}